

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,void **vtt,
          TPZGeoMesh *DestMesh,TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  atomic_int *paVar1;
  _Rb_tree_header *p_Var2;
  void *pvVar3;
  TPZReference *pTVar4;
  long *plVar5;
  long lVar6;
  ostream *poVar7;
  mapped_type_conflict *pmVar8;
  mapped_type_conflict mVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  long lVar12;
  stringstream sout;
  long local_1b8 [2];
  ostream local_1a8 [376];
  
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>,vtt + 1,
             DestMesh,&cp->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>,
             gl2lcNdMap,gl2lcElMap);
  pvVar3 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>).
             super_TPZGeoEl = pvVar3;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>).fGeo.
                   super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
            *(long *)((long)pvVar3 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  pTVar4 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar4;
  LOCK();
  paVar1 = &pTVar4->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_1b8[0] = 0;
  TPZVec<long>::Resize(&this->fSubEl,(cp->fSubEl).fNElements,local_1b8);
  if (0 < (cp->fSubEl).fNElements) {
    p_Var2 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
    lVar12 = 0;
    do {
      plVar5 = (cp->fSubEl).fStore;
      lVar6 = plVar5[lVar12];
      if (lVar6 == -1) {
        mVar9 = -1;
      }
      else {
        p_Var10 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var2->_M_header;
        if (p_Var10 == (_Base_ptr)0x0) {
LAB_00e8b2fd:
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in - ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "TPZGeoElRefPattern<pzgeom::TPZGeoBlend<TPZGeoLinear>>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZGeoBlend<TPZGeoLinear>]"
                     ,0xe0);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," subelement ",0xc);
          poVar7 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," index = ",9);
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," is not in the map.",0x13);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                     ,0x7a);
        }
        do {
          if (lVar6 <= (long)*(size_t *)(p_Var10 + 1)) {
            p_Var11 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[(long)*(size_t *)(p_Var10 + 1) < lVar6];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 == p_Var2) ||
           (lVar6 < (long)((_Rb_tree_header *)p_Var11)->_M_node_count)) goto LAB_00e8b2fd;
        pmVar8 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](gl2lcElMap,plVar5 + lVar12);
        mVar9 = *pmVar8;
      }
      (this->fSubEl).fStore[lVar12] = mVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (cp->fSubEl).fNElements);
  }
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}